

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

VTimeZone * __thiscall icu_63::VTimeZone::operator=(VTimeZone *this,VTimeZone *right)

{
  UBool UVar1;
  int iVar2;
  int32_t initialCapacity;
  undefined4 extraout_var;
  UVector *pUVar3;
  long *plVar4;
  void *obj;
  VTimeZone *size_00;
  UVector *local_70;
  UnicodeString *line;
  int32_t i;
  UErrorCode local_24;
  int32_t size;
  UErrorCode status;
  VTimeZone *right_local;
  VTimeZone *this_local;
  
  if ((this != right) &&
     (_size = right, right_local = this,
     iVar2 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0x15])
                       (this,right), (char)iVar2 != '\0')) {
    size_00 = _size;
    BasicTimeZone::operator=(&this->super_BasicTimeZone,&_size->super_BasicTimeZone);
    if (this->tz != (BasicTimeZone *)0x0) {
      if (this->tz != (BasicTimeZone *)0x0) {
        (*(this->tz->super_TimeZone).super_UObject._vptr_UObject[1])();
      }
      this->tz = (BasicTimeZone *)0x0;
    }
    if (_size->tz != (BasicTimeZone *)0x0) {
      iVar2 = (*(_size->tz->super_TimeZone).super_UObject._vptr_UObject[0xc])();
      this->tz = (BasicTimeZone *)CONCAT44(extraout_var,iVar2);
    }
    if ((this->vtzlines != (UVector *)0x0) && (this->vtzlines != (UVector *)0x0)) {
      (*(this->vtzlines->super_UObject)._vptr_UObject[1])();
    }
    if (_size->vtzlines != (UVector *)0x0) {
      local_24 = U_ZERO_ERROR;
      initialCapacity = UVector::size(_size->vtzlines);
      pUVar3 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size_00);
      local_70 = (UVector *)0x0;
      if (pUVar3 != (UVector *)0x0) {
        UVector::UVector(pUVar3,uprv_deleteUObject_63,uhash_compareUnicodeString_63,initialCapacity,
                         &local_24);
        local_70 = pUVar3;
      }
      this->vtzlines = local_70;
      UVar1 = ::U_SUCCESS(local_24);
      if (UVar1 != '\0') {
        for (line._0_4_ = 0; (int)line < initialCapacity; line._0_4_ = (int)line + 1) {
          plVar4 = (long *)UVector::elementAt(_size->vtzlines,(int)line);
          pUVar3 = this->vtzlines;
          obj = (void *)(**(code **)(*plVar4 + 0x38))();
          UVector::addElement(pUVar3,obj,&local_24);
          UVar1 = ::U_FAILURE(local_24);
          if (UVar1 != '\0') break;
        }
      }
      UVar1 = ::U_FAILURE(local_24);
      if ((UVar1 != '\0') && (this->vtzlines != (UVector *)0x0)) {
        if (this->vtzlines != (UVector *)0x0) {
          (*(this->vtzlines->super_UObject)._vptr_UObject[1])();
        }
        this->vtzlines = (UVector *)0x0;
      }
    }
    UnicodeString::operator=(&this->tzurl,&_size->tzurl);
    this->lastmod = _size->lastmod;
    UnicodeString::operator=(&this->olsonzid,&_size->olsonzid);
    UnicodeString::operator=(&this->icutzver,&_size->icutzver);
  }
  return this;
}

Assistant:

VTimeZone&
VTimeZone::operator=(const VTimeZone& right) {
    if (this == &right) {
        return *this;
    }
    if (*this != right) {
        BasicTimeZone::operator=(right);
        if (tz != NULL) {
            delete tz;
            tz = NULL;
        }
        if (right.tz != NULL) {
            tz = (BasicTimeZone*)right.tz->clone();
        }
        if (vtzlines != NULL) {
            delete vtzlines;
        }
        if (right.vtzlines != NULL) {
            UErrorCode status = U_ZERO_ERROR;
            int32_t size = right.vtzlines->size();
            vtzlines = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, size, status);
            if (U_SUCCESS(status)) {
                for (int32_t i = 0; i < size; i++) {
                    UnicodeString *line = (UnicodeString*)right.vtzlines->elementAt(i);
                    vtzlines->addElement(line->clone(), status);
                    if (U_FAILURE(status)) {
                        break;
                    }
                }
            }
            if (U_FAILURE(status) && vtzlines != NULL) {
                delete vtzlines;
                vtzlines = NULL;
            }
        }
        tzurl = right.tzurl;
        lastmod = right.lastmod;
        olsonzid = right.olsonzid;
        icutzver = right.icutzver;
    }
    return *this;
}